

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O0

void tcu::astc::anon_unknown_0::computeTexelWeights
               (TexelWeightPair *dst,Block128 *blockData,int blockWidth,int blockHeight,
               ASTCBlockMode *blockMode)

{
  int iVar1;
  deUint32 local_448 [2];
  deUint32 unquantizedWeights [64];
  undefined1 local_340 [8];
  BitAccessStream dataStream;
  ISEDecodedResult weightGrid [64];
  ASTCBlockMode *blockMode_local;
  int blockHeight_local;
  int blockWidth_local;
  Block128 *blockData_local;
  TexelWeightPair *dst_local;
  
  iVar1 = computeNumWeights(blockMode);
  iVar1 = computeNumRequiredBits(&blockMode->weightISEParams,iVar1);
  BitAccessStream::BitAccessStream((BitAccessStream *)local_340,blockData,0x7f,iVar1,false);
  iVar1 = computeNumWeights(blockMode);
  decodeISE((ISEDecodedResult *)&dataStream.m_forward,iVar1,(BitAccessStream *)local_340,
            &blockMode->weightISEParams);
  unquantizeWeights(local_448,(ISEDecodedResult *)&dataStream.m_forward,blockMode);
  interpolateWeights(dst,(deUint32 (*) [64])local_448,blockWidth,blockHeight,blockMode);
  return;
}

Assistant:

void computeTexelWeights (TexelWeightPair* dst, const Block128& blockData, int blockWidth, int blockHeight, const ASTCBlockMode& blockMode)
{
	ISEDecodedResult weightGrid[64];

	{
		BitAccessStream dataStream(blockData, 127, computeNumRequiredBits(blockMode.weightISEParams, computeNumWeights(blockMode)), false);
		decodeISE(&weightGrid[0], computeNumWeights(blockMode), dataStream, blockMode.weightISEParams);
	}

	{
		deUint32 unquantizedWeights[64];
		unquantizeWeights(&unquantizedWeights[0], &weightGrid[0], blockMode);
		interpolateWeights(dst, unquantizedWeights, blockWidth, blockHeight, blockMode);
	}
}